

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitGlobalSet(I64ToI32Lowering *this,GlobalSet *curr)

{
  GlobalSet *right;
  Type left;
  bool bVar1;
  Index index;
  size_type sVar2;
  pointer pBVar3;
  pointer this_00;
  LocalGet *value;
  Block *expression;
  char *extraout_RDX;
  Name n;
  optional<wasm::Type> type;
  undefined1 local_90 [12];
  Type local_80 [3];
  wasm *local_68;
  size_t sStack_60;
  string_view local_50;
  GlobalSet *local_40;
  GlobalSet *setHigh;
  TempVar highBits;
  GlobalSet *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  sVar2 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::count(&this->originallyI64Globals,&curr->name);
  if ((sVar2 != 0) && (bVar1 = handleUnreachable(this,(Expression *)highBits.ty.id), !bVar1)) {
    fetchOutParam((TempVar *)&setHigh,this,*(Expression **)(highBits.ty.id + 0x20));
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    local_68 = *(wasm **)(highBits.ty.id + 0x10);
    sStack_60 = *(size_t *)(highBits.ty.id + 0x18);
    n.super_IString.str._M_str = extraout_RDX;
    n.super_IString.str._M_len = sStack_60;
    local_50 = (string_view)makeHighName(local_68,n);
    this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                        (&this->builder);
    index = TempVar::operator_cast_to_unsigned_int((TempVar *)&setHigh);
    wasm::Type::Type(local_80,i32);
    value = Builder::makeLocalGet(this_00,index,local_80[0]);
    local_40 = Builder::makeGlobalSet(pBVar3,(Name)local_50,(Expression *)value);
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    left = highBits.ty;
    right = local_40;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_90);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_90._0_8_
    ;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_90[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_90._9_3_;
    expression = Builder::makeSequence(pBVar3,(Expression *)left.id,(Expression *)right,type);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)expression);
    TempVar::~TempVar((TempVar *)&setHigh);
  }
  return;
}

Assistant:

void visitGlobalSet(GlobalSet* curr) {
    if (!originallyI64Globals.count(curr->name)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    TempVar highBits = fetchOutParam(curr->value);
    auto* setHigh = builder->makeGlobalSet(
      makeHighName(curr->name), builder->makeLocalGet(highBits, Type::i32));
    replaceCurrent(builder->makeSequence(curr, setHigh));
  }